

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O1

int main(int argc,char **argv)

{
  vector<run,std::allocator<run>> *this;
  iterator __position;
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  istream *piVar5;
  ostream *poVar6;
  logic_error *this_00;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  uint i;
  ulong uVar12;
  undefined1 auVar13 [16];
  uint cols;
  uint rows;
  string line;
  grid b;
  istringstream iss;
  ifstream is;
  uint local_434;
  uint local_430;
  uint uStack_42c;
  uint local_428;
  uint uStack_424;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined7 uStack_407;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  pointer local_3c8;
  long local_3b8 [4];
  byte abStack_398 [88];
  ios_base local_340 [264];
  run local_238;
  long local_228 [2];
  byte abStack_218 [488];
  
  local_3d8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3c8 = (pointer)0x0;
  if (argc != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"USAGE: ",7);
    pcVar11 = *argv;
    if (pcVar11 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108190);
    }
    else {
      sVar4 = strlen(pcVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," INPUT-FILE",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    iVar3 = 1;
    std::ostream::flush();
    goto LAB_00102d76;
  }
  std::
  vector<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
  ::resize(&G_sum_table,0x2e);
  uVar12 = 0;
  do {
    local_238.set_.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(uVar12 * 2);
    local_238.target_sum_ = 0;
    uVar7 = 1;
    uVar8 = 0;
    do {
      if (((ulong)local_238.set_.super__Base_bitset<1UL>._M_w >> (uVar7 & 0x3f) & 1) != 0) {
        uVar8 = uVar8 + (int)uVar7;
        local_238.target_sum_ = uVar8;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 10);
    uVar7 = (long)local_238.set_.super__Base_bitset<1UL>._M_w - (uVar12 & 0x1555555555555555);
    uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
    local_238.size_ =
         (uint)(byte)(((uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    this = (vector<run,std::allocator<run>> *)
           (G_sum_table.
            super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + local_238.target_sum_);
    __position._M_current = *(run **)(this + 8);
    if (__position._M_current == *(run **)(this + 0x10)) {
      std::vector<run,std::allocator<run>>::_M_realloc_insert<run_const&>
                (this,__position,&local_238);
    }
    else {
      (__position._M_current)->size_ = local_238.size_;
      (__position._M_current)->target_sum_ = local_238.target_sum_;
      ((__position._M_current)->set_).super__Base_bitset<1UL>._M_w =
           (_WordT)local_238.set_.super__Base_bitset<1UL>._M_w;
      *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,argv[1],(allocator<char> *)local_3b8);
  iVar3 = std::__cxx11::string::compare((char *)&local_238);
  if ((long *)CONCAT44(local_238.target_sum_,local_238.size_) != local_228) {
    operator_delete((long *)CONCAT44(local_238.target_sum_,local_238.size_),local_228[0] + 1);
  }
  if (iVar3 == 0) {
    lVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SUM: ",5);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"==== ",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if (G_sum_table.
          super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar9].
          super__Vector_base<run,_std::allocator<run>_>._M_impl.super__Vector_impl_data._M_finish !=
          G_sum_table.
          super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar9].
          super__Vector_base<run,_std::allocator<run>_>._M_impl.super__Vector_impl_data._M_start) {
        uVar12 = 0;
        do {
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          uVar7 = 0;
          do {
            if ((G_sum_table.
                 super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].
                 super__Vector_base<run,_std::allocator<run>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar12].set_.super__Base_bitset<1UL>._M_w >> (uVar7 & 0x3f) & 1) != 0) {
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != 10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (uVar12 < (ulong)((long)G_sum_table.
                                        super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                        super__Vector_base<run,_std::allocator<run>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)G_sum_table.
                                        super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                        super__Vector_base<run,_std::allocator<run>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 4));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x2e);
    iVar3 = 0;
    goto LAB_00102d76;
  }
  std::ifstream::ifstream(&local_238,argv[1],_S_in);
  if ((abStack_218[*(long *)(CONCAT44(local_238.target_sum_,local_238.size_) + -0x18)] & 5) == 0) {
    local_410 = 0;
    local_408 = 0;
    local_418 = &local_408;
    cVar1 = std::ios::widen((char)&local_238 +
                            (char)*(undefined8 *)
                                   (CONCAT44(local_238.target_sum_,local_238.size_) + -0x18));
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_238,(string *)&local_418,cVar1);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_418,_S_in);
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)local_3b8);
      piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        lVar9 = 0x17;
        pcVar11 = "invalid dimensions line";
LAB_00102cdd:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
LAB_00102d17:
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
        goto LAB_00102d38;
      }
      if (local_430 < 2 || local_428 < 2) {
        lVar9 = 0x39;
        pcVar11 = "invalid dimensions (must be at least 2 in each direction)";
        goto LAB_00102cdd;
      }
      grid::set_size((grid *)local_3f8,local_428,local_430);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
      cVar1 = std::ios::widen((char)&local_238 +
                              (char)*(undefined8 *)
                                     (CONCAT44(local_238.target_sum_,local_238.size_) + -0x18));
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_238,(string *)&local_418,cVar1);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        lVar9 = 0x27;
        pcVar11 = "error reading the unfillable cells line";
        goto LAB_00102c21;
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_418,_S_in);
      while (piVar5 = std::istream::_M_extract<unsigned_int>((uint *)local_3b8),
            ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        *(uint *)(local_3f8._8_8_ + (ulong)local_434 * 4) = 0xffffffff;
      }
      if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 2) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"invalid unfillable cells line",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        goto LAB_00102d17;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
      while( true ) {
        cVar1 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_238.target_sum_,local_238.size_) + -0x18) +
                                (char)&local_238);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_238,(string *)&local_418,cVar1);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b8,(string *)&local_418,_S_in);
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)local_3b8);
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
        piVar5 = std::istream::_M_extract<unsigned_int>((uint *)piVar5);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"invalid input format for constraint index ",0x2a);
LAB_00103117:
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_00102d17;
        }
        auVar13._0_4_ = -(uint)(-0x7fffffd3 < (int)(local_428 ^ 0x80000000));
        auVar13._4_4_ = -(uint)(-0x7fffffd3 < (int)(uStack_424 ^ 0x80000000));
        auVar13._8_4_ = -(uint)(-0x7ffffff7 < (int)(local_428 ^ 0x80000000));
        auVar13._12_4_ = -(uint)(-0x7ffffff7 < (int)(uStack_424 ^ 0x80000000));
        iVar3 = movmskps((int)piVar5,auVar13);
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"inconsistent data for constraint index ",0x27);
          goto LAB_00103117;
        }
        bVar2 = grid::add_run((grid *)local_3f8,local_434,local_428,local_428,DOWN);
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"overflowing (down?) run or misplaced constraint cell ",
                     0x35);
          goto LAB_00103117;
        }
        bVar2 = grid::add_run((grid *)local_3f8,local_434,uStack_424,uStack_42c,RIGHT);
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"overflowing (right?) run or misplaced constraint cell ",
                     0x36);
          goto LAB_00103117;
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
      }
      bVar2 = true;
      if (local_3e8._0_8_ - local_3f8._8_8_ != 0) {
        uVar12 = 1;
        uVar7 = 0;
        do {
          uVar10 = uVar12;
          uVar8 = *(pointer)(local_3f8._8_8_ + uVar7 * 4);
          if (uVar8 != 0xffffffff) {
            if (uVar8 == 0) {
              if ((((pointer)(local_3d8._0_8_ + uVar7 * 0x10))->r_[0] != (run *)0x0) &&
                 (((pointer)(local_3d8._0_8_ + uVar7 * 0x10))->r_[1] != (run *)0x0))
              goto LAB_0010309f;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"incompletely covered cell ",0x1a);
            }
            else {
              if (uVar8 != 0xfffffffe) {
                this_00 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(this_00,"invalid grid initialization");
                __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"uncovered cell ",0xf);
            }
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::endl<char,std::char_traits<char>>(poVar6);
            goto LAB_00102d38;
          }
LAB_0010309f:
          uVar12 = (ulong)((int)uVar10 + 1);
          uVar7 = uVar10;
        } while (uVar10 < (ulong)((long)(local_3e8._0_8_ - local_3f8._8_8_) >> 2));
      }
    }
    else {
      lVar9 = 0x21;
      pcVar11 = "error reading the dimensions line";
LAB_00102c21:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar11,lVar9);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
LAB_00102d38:
      bVar2 = false;
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
    }
    iVar3 = 1;
    if (bVar2) {
      iVar3 = 0;
      solve((grid *)local_3f8,0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open input file",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    iVar3 = 1;
    std::ostream::flush();
  }
  std::ifstream::~ifstream(&local_238);
LAB_00102d76:
  if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3d8._0_8_,(long)local_3c8 - local_3d8._0_8_);
  }
  if ((pointer)local_3f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ - local_3f8._8_8_);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) try {
	grid b;
	
	if(argc != 2) {
		cerr << "USAGE: " << argv[0] << " INPUT-FILE" << endl;
		return 1;
	}

	generate_sum_table();
	if(string(argv[1]) == "-test") {
		print_sum_table();
		return 0;
	}

	ifstream is(argv[1]);
	if(!is) {
		cerr << "can't open input file" << endl;
		return 1;
	}

	if(!read_data(is, b))
		return 1;
	solve(b, 0);
	return 0;
} catch(exception &e) {
	cerr << "INTERNAL ERROR: " << e.what() << endl;
	return 1;
}